

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::enableOnlyOneDisplayer(SimpleLoggerMgr *this)

{
  bool bVar1;
  reference ppSVar2;
  SimpleLogger *in_RDI;
  SimpleLogger *logger;
  SimpleLogger **entry;
  iterator __end1;
  iterator __begin1;
  unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
  *__range1;
  unique_lock<std::mutex> l;
  bool marked;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  SimpleLogger *in_stack_ffffffffffffffa8;
  _Node_iterator_base<SimpleLogger_*,_false> local_38;
  _Node_iterator_base<SimpleLogger_*,_false> local_30;
  size_t *local_28;
  byte local_9;
  
  local_9 = 0;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_RDI,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_28 = &in_RDI->curRevnum;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
       ::begin((unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
       ::end((unordered_set<SimpleLogger_*,_std::hash<SimpleLogger_*>,_std::equal_to<SimpleLogger_*>,_std::allocator<SimpleLogger_*>_>
              *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  while (bVar1 = std::__detail::operator!=(&local_30,&local_38), bVar1) {
    ppSVar2 = std::__detail::_Node_iterator<SimpleLogger_*,_true,_false>::operator*
                        ((_Node_iterator<SimpleLogger_*,_true,_false> *)0x1c2c60);
    if (*ppSVar2 != (SimpleLogger *)0x0) {
      if ((local_9 & 1) == 0) {
        in_stack_ffffffffffffff9c = SimpleLogger::getLogLevel(in_stack_ffffffffffffffa8);
        if (in_stack_ffffffffffffff9c < 4) {
          SimpleLogger::setLogLevel(in_RDI,in_stack_ffffffffffffff9c);
        }
        SimpleLogger::setDispLevel(in_RDI,in_stack_ffffffffffffff9c);
        local_9 = 1;
      }
      else {
        SimpleLogger::setDispLevel(in_RDI,in_stack_ffffffffffffff9c);
      }
    }
    std::__detail::_Node_iterator<SimpleLogger_*,_true,_false>::operator++
              ((_Node_iterator<SimpleLogger_*,_true,_false> *)in_RDI);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_RDI);
  return;
}

Assistant:

void SimpleLoggerMgr::enableOnlyOneDisplayer() {
    bool marked = false;
    std::unique_lock<std::mutex> l(loggersLock);
    for (auto& entry: loggers) {
        SimpleLogger* logger = entry;
        if (!logger) continue;
        if (!marked) {
            // The first logger: enable display
            if (logger->getLogLevel() < 4) {
                logger->setLogLevel(4);
            }
            logger->setDispLevel(4);
            marked = true;
        } else {
            // The others: disable display
            logger->setDispLevel(-1);
        }
    }
}